

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTimeZone::OffsetData>::moveAppend
          (QGenericArrayOps<QTimeZone::OffsetData> *this,OffsetData *b,OffsetData *e)

{
  qsizetype *pqVar1;
  OffsetData *pOVar2;
  OffsetData *pOVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  int iVar8;
  
  if ((b != e) && (b < e)) {
    pOVar3 = (this->super_QArrayDataPointer<QTimeZone::OffsetData>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<QTimeZone::OffsetData>).size;
      pDVar5 = (b->abbreviation).d.d;
      (b->abbreviation).d.d = (Data *)0x0;
      pOVar2 = pOVar3 + lVar4;
      (pOVar2->abbreviation).d.d = pDVar5;
      pcVar6 = (b->abbreviation).d.ptr;
      (b->abbreviation).d.ptr = (char16_t *)0x0;
      (pOVar2->abbreviation).d.ptr = pcVar6;
      qVar7 = (b->abbreviation).d.size;
      (b->abbreviation).d.size = 0;
      (pOVar2->abbreviation).d.size = qVar7;
      QDateTime::QDateTime(&pOVar2->atUtc,&b->atUtc);
      pOVar2->daylightTimeOffset = b->daylightTimeOffset;
      iVar8 = b->standardTimeOffset;
      pOVar2->offsetFromUtc = b->offsetFromUtc;
      pOVar2->standardTimeOffset = iVar8;
      pqVar1 = &(this->super_QArrayDataPointer<QTimeZone::OffsetData>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }